

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int * generateProperInputVector(Abc_Ntk_t *pNtk,coloring *c,Vec_Int_t *randomVector)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *__ptr;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = pNtk->vPos->nSize;
  lVar7 = (long)iVar6;
  iVar5 = pNtk->vPis->nSize;
  iVar2 = iVar5 + iVar6;
  __ptr = (int *)malloc((long)iVar5 << 2);
  iVar5 = 0;
  while( true ) {
    if (iVar2 <= iVar6) {
      return __ptr;
    }
    if (iVar5 == randomVector->nSize) break;
    iVar3 = Vec_IntEntry(randomVector,iVar5);
    lVar4 = (long)iVar6;
    iVar1 = c->clen[lVar4];
    for (; lVar4 <= iVar1 + iVar6; lVar4 = lVar4 + 1) {
      __ptr[c->lab[lVar4] - lVar7] = iVar3;
    }
    iVar6 = iVar6 + iVar1 + 1;
    iVar5 = iVar5 + 1;
  }
  free(__ptr);
  return (int *)0x0;
}

Assistant:

static int * 
generateProperInputVector( Abc_Ntk_t * pNtk, struct coloring *c, Vec_Int_t * randomVector )
{
    int * vPiValues;    
    int i, j, k, bit, input;
    int numouts =  Abc_NtkPoNum(pNtk);
    int numins =  Abc_NtkPiNum(pNtk);
    int n = numouts + numins;

    vPiValues = ABC_ALLOC( int,  numins);   

    for (i = numouts, k = 0; i < n; i += (c->clen[i]+1), k++) {
        if (k == Vec_IntSize(randomVector)) break;

        bit = Vec_IntEntry(randomVector, k);
        for (j = i; j <= (i + c->clen[i]); j++) {
            input = c->lab[j] - numouts;
            vPiValues[input] = bit;
        }
    }

    //if (k != Vec_IntSize(randomVector)) {
    if (i < n) {
        ABC_FREE( vPiValues );
        return NULL;
    }

    return vPiValues;
}